

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(MessageGenerator *this,Printer *p)

{
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  CppType CVar8;
  reference ppFVar9;
  pointer pFVar10;
  bool *pbVar11;
  bool *pbVar12;
  LogMessage *pLVar13;
  const_reference ppFVar14;
  FieldDescriptor *pFVar15;
  FieldGenerator *pFVar16;
  value_type this_00;
  DescriptorStringView args;
  undefined1 split;
  AlphaNum *a;
  anon_class_24_3_dc47fae8 *in_R8;
  undefined1 auVar17 [16];
  Iterator IVar18;
  bool local_519;
  bool local_511;
  byte local_447;
  byte local_445;
  byte local_40a;
  value_type oneof;
  Iterator __end3_1;
  Iterator __begin3_1;
  OneOfRangeImpl *__range3_1;
  basic_string_view<char,_std::char_traits<char>_> local_380;
  bool local_369;
  reference ppFStack_368;
  bool have_enclosing_if;
  FieldDescriptor **field_2;
  const_iterator __end5_1;
  const_iterator __begin5_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range5_1;
  string local_328;
  undefined1 local_308 [16];
  LogMessageFatal local_2f8 [22];
  Voidify local_2e2;
  bool local_2e1;
  string *local_2e0;
  string *absl_log_internal_check_op_result_4;
  undefined8 local_2d0;
  LogMessageFatal local_2c8 [22];
  Voidify local_2b2;
  bool local_2b1;
  string *local_2b0;
  string *absl_log_internal_check_op_result_3;
  undefined8 local_2a0;
  LogMessageFatal local_298 [23];
  Voidify local_281;
  string *local_280;
  string *absl_log_internal_check_op_result_2;
  undefined8 local_270;
  LogMessageFatal local_268 [23];
  Voidify local_251;
  string *local_250;
  string *absl_log_internal_check_op_result_1;
  size_type sStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_238;
  Hex local_228;
  AlphaNum local_218;
  undefined1 local_1e8 [8];
  string chunk_mask_str;
  uint32_t chunk_mask;
  bool check_has_byte;
  char *local_1b8;
  LogMessageFatal local_1b0 [23];
  Voidify local_199;
  reference local_198;
  FieldDescriptor **field_1;
  const_iterator __end5;
  const_iterator __begin5;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range5;
  FieldDescriptor *pFStack_170;
  bool saw_non_zero_init;
  FieldDescriptor *memset_end;
  FieldDescriptor *memset_start;
  LogMessageFatal local_150 [23];
  Voidify local_139;
  string *local_138;
  string *absl_log_internal_check_op_result;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvStack_128;
  bool chunk_is_split;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  undefined1 local_118 [6];
  bool has_default_split_check;
  ChunkIterator local_f8;
  ChunkIterator local_f0;
  byte local_e1;
  ChunkIterator CStack_e0;
  bool has_haswords_check;
  ChunkIterator local_d8;
  __normal_iterator<const_google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
  local_d0;
  ChunkIterator next;
  iterator iStack_c0;
  int cached_has_word_index;
  iterator end;
  iterator it;
  undefined1 local_98 [8];
  vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
  chunks;
  int chunk_count;
  bool merge_zero_init;
  FieldDescriptor **field;
  iterator __end3;
  iterator __begin3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range3;
  int zero_init_bytes;
  undefined1 local_40 [4];
  int kMaxUnconditionalPrimitiveBytesClear;
  Formatter format;
  Printer *p_local;
  MessageGenerator *this_local;
  
  format.vars_.
  super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.slot_array = (MaybeInitializedPtr)p;
  bVar3 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  if (!bVar3) {
    Formatter::Formatter
              ((Formatter *)local_40,
               (Printer *)
               format.vars_.
               super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .
               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               .settings_.
               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
               value.heap_or_soo_.heap.slot_array);
    Formatter::operator()<>
              ((Formatter *)local_40,
               "PROTOBUF_NOINLINE void $classname$::Clear() {\n// @@protoc_insertion_point(message_clear_start:$full_name$)\n"
              );
    Formatter::Indent((Formatter *)local_40);
    Formatter::operator()<>((Formatter *)local_40,"$pbi$::TSanWrite(&_impl_);\n");
    Formatter::operator()<>
              ((Formatter *)local_40,
               "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
              );
    iVar5 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar5) {
      Formatter::operator()<>((Formatter *)local_40,"$extensions$.Clear();\n");
    }
    __range3._0_4_ = 0;
    __end3 = std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::begin(&this->optimized_order_);
    field = (FieldDescriptor **)
            std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::end(&this->optimized_order_);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                       *)&field), bVar3) {
      ppFVar9 = __gnu_cxx::
                __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                ::operator*(&__end3);
      bVar3 = CanClearByZeroing(*ppFVar9);
      if (bVar3) {
        iVar5 = EstimateAlignmentSize(*ppFVar9);
        __range3._0_4_ = iVar5 + (int)__range3;
      }
      __gnu_cxx::
      __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
      ::operator++(&__end3);
    }
    chunks.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 4 < (int)__range3;
    chunks.
    super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    it._M_current =
         (FieldChunk *)
         &chunks.
          super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (anonymous_namespace)::
    CollectFields<google::protobuf::compiler::cpp::MessageGenerator::GenerateClear(google::protobuf::io::Printer*)::__0>
              ((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                *)local_98,(_anonymous_namespace_ *)&this->optimized_order_,
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)&this->options_,(Options *)&it,in_R8);
    end = std::
          vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
          ::begin((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                   *)local_98);
    iStack_c0 = std::
                vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                ::end((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                       *)local_98);
    next._M_current._4_4_ = -1;
    while (bVar3 = __gnu_cxx::operator!=(&end,&stack0xffffffffffffff40), bVar3) {
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
      ::__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk*>
                ((__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
                  *)&local_d8,&end);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
      ::__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk*>
                ((__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
                  *)&stack0xffffffffffffff20,&stack0xffffffffffffff40);
      local_d0._M_current =
           (FieldChunk *)
           (anonymous_namespace)::
           FindNextUnequalChunk<bool(google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const&,google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const&)>
                     (local_d8,CStack_e0,anon_unknown_0::MayGroupChunksForHaswordsCheck);
      __gnu_cxx::
      __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
      ::__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk*>
                ((__normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_const*,std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>>>
                  *)&local_f0,&end);
      iVar5 = next._M_current._4_4_;
      local_f8._M_current = local_d0._M_current;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_118,"",(allocator<char> *)((long)&fields + 7));
      bVar3 = anon_unknown_0::MaybeEmitHaswordsCheck
                        (local_f0,local_f8,&this->options_,&this->has_bit_indices_,iVar5,
                         (string *)local_118,
                         (Printer *)
                         format.vars_.
                         super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .
                         super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array);
      std::__cxx11::string::~string((string *)local_118);
      std::allocator<char>::~allocator((allocator<char> *)((long)&fields + 7));
      local_e1 = bVar3;
      pFVar10 = __gnu_cxx::
                __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
                ::operator->(&end);
      bVar3 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::empty(&pFVar10->fields);
      local_40a = 0;
      if (!bVar3) {
        pFVar10 = __gnu_cxx::
                  __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
                  ::operator->(&end);
        local_40a = pFVar10->should_split;
      }
      fields._6_1_ = local_40a & 1;
      if (fields._6_1_ != 0) {
        Formatter::operator()<>((Formatter *)local_40,"if (!IsSplitMessageDefault()) {\n");
        Formatter::Indent((Formatter *)local_40);
      }
      while (bVar3 = __gnu_cxx::operator!=(&end,&local_d0), bVar3) {
        pFVar10 = __gnu_cxx::
                  __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
                  ::operator->(&end);
        pvStack_128 = &pFVar10->fields;
        pFVar10 = __gnu_cxx::
                  __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
                  ::operator->(&end);
        absl_log_internal_check_op_result._7_1_ = pFVar10->should_split & 1;
        pbVar11 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                            ((bool *)((long)&fields + 6));
        pbVar12 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                            ((bool *)((long)&absl_log_internal_check_op_result + 7));
        local_138 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                              (pbVar11,pbVar12,"has_default_split_check == chunk_is_split");
        pvVar1 = pvStack_128;
        if (local_138 != (string *)0x0) {
          auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_138);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_150,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                     ,0xdb2,auVar17._0_8_,auVar17._8_8_);
          pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_150);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_139,pLVar13);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_150);
        }
        memset_end = (FieldDescriptor *)0x0;
        pFStack_170 = (FieldDescriptor *)0x0;
        bVar3 = false;
        __end5 = std::
                 vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ::begin(pvStack_128);
        field_1 = (FieldDescriptor **)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end(pvVar1);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                           *)&field_1), bVar4) {
          local_198 = __gnu_cxx::
                      __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                      ::operator*(&__end5);
          bVar4 = CanClearByZeroing(*local_198);
          if (bVar4) {
            chunk_mask_str.field_2._M_local_buf[0xf] = '\0';
            if (bVar3) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)&chunk_mask,
                         "!saw_non_zero_init");
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_1b0,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xdba,_chunk_mask,local_1b8);
              chunk_mask_str.field_2._M_local_buf[0xf] = '\x01';
              pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)local_1b0);
              absl::lts_20240722::log_internal::Voidify::operator&&(&local_199,pLVar13);
            }
            if ((chunk_mask_str.field_2._M_local_buf[0xf] & 1U) != 0) {
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_1b0);
            }
            if (memset_end == (FieldDescriptor *)0x0) {
              memset_end = *local_198;
            }
            pFStack_170 = *local_198;
          }
          else {
            bVar3 = true;
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end5);
        }
        ppFVar14 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::front(pvStack_128);
        uVar6 = HasBitIndex(this,*ppFVar14);
        local_445 = 0;
        pFVar15 = (FieldDescriptor *)(ulong)uVar6;
        if (uVar6 != 0xffffffff) {
          pFVar15 = (FieldDescriptor *)
                    std::
                    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ::size(pvStack_128);
          local_445 = 0;
          if ((FieldDescriptor *)0x1 < pFVar15) {
            ppFVar14 = std::
                       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::back(pvStack_128);
            bVar3 = IsLikelyPresent(*ppFVar14,&this->options_);
            local_445 = 0;
            pFVar15 = (FieldDescriptor *)(ulong)bVar3;
            if (!bVar3) {
              ppFVar14 = std::
                         vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                         ::back(pvStack_128);
              local_447 = 1;
              if (pFStack_170 == *ppFVar14) {
                local_447 = chunks.
                            super__Vector_base<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
              }
              local_445 = local_447;
              pFVar15 = pFStack_170;
            }
          }
        }
        split = SUB81(pFVar15,0);
        chunk_mask_str.field_2._M_local_buf[0xe] = local_445 & 1;
        if (chunk_mask_str.field_2._M_local_buf[0xe] != 0) {
          chunk_mask_str.field_2._8_4_ =
               anon_unknown_0::GenChunkMask(pvStack_128,&this->has_bit_indices_);
          absl::lts_20240722::Hex::Hex<unsigned_int>
                    (&local_228,chunk_mask_str.field_2._8_4_,kZeroPad8,(type *)0x0);
          local_238._M_allocated_capacity = 0;
          local_238._8_8_ = 0;
          absl_log_internal_check_op_result_1 = (string *)0x0;
          sStack_240 = 0;
          absl::lts_20240722::strings_internal::StringifySink::StringifySink
                    ((StringifySink *)&absl_log_internal_check_op_result_1);
          absl::lts_20240722::AlphaNum::AlphaNum<absl::lts_20240722::Hex,void>
                    (&local_218,&local_228,(StringifySink *)&absl_log_internal_check_op_result_1);
          absl::lts_20240722::StrCat_abi_cxx11_((string *)local_1e8,(lts_20240722 *)&local_218,a);
          absl::lts_20240722::strings_internal::StringifySink::~StringifySink
                    ((StringifySink *)&absl_log_internal_check_op_result_1);
          iVar5 = absl::lts_20240722::log_internal::GetReferenceableValue(2);
          iVar7 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
          iVar7 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar7);
          local_250 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                                (iVar5,iVar7,"2 <= popcnt(chunk_mask)");
          if (local_250 != (string *)0x0) {
            auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_250);
            local_270 = auVar17._8_8_;
            absl_log_internal_check_op_result_2 = auVar17._0_8_;
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_268,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                       ,0xdd5,absl_log_internal_check_op_result_2,local_270);
            pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                ((LogMessage *)local_268);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_251,pLVar13);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_268);
          }
          iVar5 = absl::lts_20240722::log_internal::GetReferenceableValue(8);
          iVar7 = anon_unknown_0::popcnt(chunk_mask_str.field_2._8_4_);
          iVar7 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar7);
          local_280 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_
                                (iVar5,iVar7,"8 >= popcnt(chunk_mask)");
          iVar5 = next._M_current._4_4_;
          if (local_280 != (string *)0x0) {
            auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_280);
            local_2a0 = auVar17._8_8_;
            absl_log_internal_check_op_result_3 = auVar17._0_8_;
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      (local_298,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                       ,0xdd6,absl_log_internal_check_op_result_3,local_2a0);
            pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                ((LogMessage *)local_298);
            absl::lts_20240722::log_internal::Voidify::operator&&(&local_281,pLVar13);
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_298);
          }
          ppFVar14 = std::
                     vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ::front(pvStack_128);
          iVar7 = HasWordIndex(this,*ppFVar14);
          split = (undefined1)iVar7;
          if (iVar5 != iVar7) {
            ppFVar14 = std::
                       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ::front(pvStack_128);
            next._M_current._4_4_ = HasWordIndex(this,*ppFVar14);
            Formatter::operator()
                      ((Formatter *)local_40,"cached_has_bits = $has_bits$[$1$];\n",
                       (int *)((long)&next._M_current + 4));
          }
          Formatter::operator()
                    ((Formatter *)local_40,"if (cached_has_bits & 0x$1$u) {\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8)
          ;
          Formatter::Indent((Formatter *)local_40);
          std::__cxx11::string::~string((string *)local_1e8);
        }
        if (memset_end != (FieldDescriptor *)0x0) {
          if (memset_end == pFStack_170) {
            pFVar16 = FieldGeneratorTable::get(&this->field_generators_,memset_end);
            FieldGenerator::GenerateMessageClearingCode
                      (pFVar16,(Printer *)
                               format.vars_.
                               super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_.heap.slot_array);
          }
          else {
            pbVar11 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                                ((bool *)((long)&absl_log_internal_check_op_result + 7));
            local_2b1 = ShouldSplit(memset_end,&this->options_);
            pbVar12 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_2b1);
            local_2b0 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                                  (pbVar11,pbVar12,
                                   "chunk_is_split == ShouldSplit(memset_start, options_)");
            if (local_2b0 != (string *)0x0) {
              auVar17 = std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_2b0);
              local_2d0 = auVar17._8_8_;
              absl_log_internal_check_op_result_4 = auVar17._0_8_;
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_2c8,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xde5,absl_log_internal_check_op_result_4,local_2d0);
              pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)local_2c8);
              absl::lts_20240722::log_internal::Voidify::operator&&(&local_2b2,pLVar13);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_2c8);
            }
            pbVar11 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>
                                ((bool *)((long)&absl_log_internal_check_op_result + 7));
            local_2e1 = ShouldSplit(pFStack_170,&this->options_);
            pbVar12 = absl::lts_20240722::log_internal::GetReferenceableValue<bool>(&local_2e1);
            local_2e0 = absl::lts_20240722::log_internal::Check_EQImpl<bool,bool>
                                  (pbVar11,pbVar12,
                                   "chunk_is_split == ShouldSplit(memset_end, options_)");
            if (local_2e0 != (string *)0x0) {
              local_308 = std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_2e0);
              absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                        (local_2f8,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                         ,0xde6,local_308._0_8_,local_308._8_8_);
              pLVar13 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                                  ((LogMessage *)local_2f8);
              absl::lts_20240722::log_internal::Voidify::operator&&(&local_2e2,pLVar13);
              absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_2f8);
            }
            FieldMemberName_abi_cxx11_
                      (&local_328,(cpp *)memset_end,
                       (FieldDescriptor *)(ulong)(absl_log_internal_check_op_result._7_1_ & 1),
                       (bool)split);
            FieldMemberName_abi_cxx11_
                      ((string *)&__range5_1,(cpp *)pFStack_170,
                       (FieldDescriptor *)(ulong)(absl_log_internal_check_op_result._7_1_ & 1),
                       (bool)split);
            Formatter::operator()
                      ((Formatter *)local_40,
                       "::memset(&$1$, 0, static_cast<::size_t>(\n    reinterpret_cast<char*>(&$2$) -\n    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n"
                       ,&local_328,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range5_1);
            std::__cxx11::string::~string((string *)&__range5_1);
            std::__cxx11::string::~string((string *)&local_328);
          }
        }
        pvVar1 = pvStack_128;
        __end5_1 = std::
                   vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ::begin(pvStack_128);
        field_2 = (FieldDescriptor **)
                  std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::end(pvVar1);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end5_1,
                                  (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                   *)&field_2), bVar3) {
          ppFStack_368 = __gnu_cxx::
                         __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                         ::operator*(&__end5_1);
          bVar3 = CanClearByZeroing(*ppFStack_368);
          if (!bVar3) {
            iVar5 = HasBitIndex(this,*ppFStack_368);
            local_511 = false;
            if (iVar5 != -1) {
              CVar8 = FieldDescriptor::cpp_type(*ppFStack_368);
              local_519 = true;
              if (CVar8 != CPPTYPE_MESSAGE) {
                CVar8 = FieldDescriptor::cpp_type(*ppFStack_368);
                local_519 = CVar8 == CPPTYPE_STRING;
              }
              local_511 = local_519;
            }
            local_369 = local_511;
            if (local_511 != false) {
              anon_unknown_0::PrintPresenceCheck
                        (*ppFStack_368,&this->has_bit_indices_,
                         (Printer *)
                         format.vars_.
                         super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .
                         super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         .settings_.
                         super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                         .
                         super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                         .value.heap_or_soo_.heap.slot_array,(int *)((long)&next._M_current + 4));
              Formatter::Indent((Formatter *)local_40);
            }
            pFVar16 = FieldGeneratorTable::get(&this->field_generators_,*ppFStack_368);
            FieldGenerator::GenerateMessageClearingCode
                      (pFVar16,(Printer *)
                               format.vars_.
                               super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .
                               super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               .settings_.
                               super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                               .
                               super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                               .value.heap_or_soo_.heap.slot_array);
            if ((local_369 & 1U) != 0) {
              Formatter::Outdent((Formatter *)local_40);
              Formatter::operator()<>((Formatter *)local_40,"}\n");
            }
          }
          __gnu_cxx::
          __normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
          ::operator++(&__end5_1);
        }
        if ((chunk_mask_str.field_2._M_local_buf[0xe] & 1U) != 0) {
          Formatter::Outdent((Formatter *)local_40);
          Formatter::operator()<>((Formatter *)local_40,"}\n");
        }
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk_*,_std::vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>_>
        ::operator++(&end);
      }
      if ((fields._6_1_ & 1) != 0) {
        Formatter::Outdent((Formatter *)local_40);
        Formatter::operator()<>((Formatter *)local_40,"}\n");
      }
      if ((local_e1 & 1) != 0) {
        google::protobuf::io::Printer::Outdent();
        uVar2 = format.vars_.
                super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .
                super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                .settings_.
                super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.
                value.heap_or_soo_.heap.slot_array;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_380,"\n        }\n      ");
        io::Printer::SourceLocation::current();
        io::Printer::Emit((Printer *)uVar2,local_380._M_len,local_380._M_str);
        next._M_current._4_4_ = -1;
      }
    }
    __begin3_1.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar18 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3_1.descriptor);
    __begin3_1._0_8_ = IVar18.descriptor;
    __end3_1.descriptor._0_4_ = IVar18.idx;
    IVar18 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3_1.descriptor);
    __end3_1._0_8_ = IVar18.descriptor;
    oneof._0_4_ = IVar18.idx;
    while (bVar3 = cpp::operator!=((Iterator *)&__end3_1.descriptor,(Iterator *)&oneof), bVar3) {
      this_00 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3_1.descriptor);
      args = OneofDescriptor::name_abi_cxx11_(this_00);
      Formatter::operator()((Formatter *)local_40,"clear_$1$();\n",args);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3_1.descriptor);
    }
    if (this->num_weak_fields_ != 0) {
      Formatter::operator()<>((Formatter *)local_40,"$weak_field_map$.ClearAll();\n");
    }
    bVar3 = std::vector<int,_std::allocator<int>_>::empty(&this->has_bit_indices_);
    if (!bVar3) {
      Formatter::operator()<>((Formatter *)local_40,"$has_bits$.Clear();\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_40,"_internal_metadata_.Clear<$unknown_fields_type$>();\n");
    Formatter::Outdent((Formatter *)local_40);
    Formatter::operator()<>((Formatter *)local_40,"}\n");
    std::
    vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
    ::~vector((vector<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::(anonymous_namespace)::FieldChunk>_>
               *)local_98);
    Formatter::~Formatter((Formatter *)local_40);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(p);

  // The maximum number of bytes we will memset to zero without checking their
  // hasbit to see if a zero-init is necessary.
  const int kMaxUnconditionalPrimitiveBytesClear = 4;

  format(
      "PROTOBUF_NOINLINE void $classname$::Clear() {\n"
      "// @@protoc_insertion_point(message_clear_start:$full_name$)\n");
  format.Indent();

  format("$pbi$::TSanWrite(&_impl_);\n");

  format(
      // TODO: It would be better to avoid emitting this if it is not used,
      // rather than emitting a workaround for the resulting warning.
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  if (descriptor_->extension_range_count() > 0) {
    format("$extensions$.Clear();\n");
  }

  // Collect fields into chunks. Each chunk may have an if() condition that
  // checks all hasbits in the chunk and skips it if none are set.
  int zero_init_bytes = 0;
  for (const auto& field : optimized_order_) {
    if (CanClearByZeroing(field)) {
      zero_init_bytes += EstimateAlignmentSize(field);
    }
  }
  bool merge_zero_init = zero_init_bytes > kMaxUnconditionalPrimitiveBytesClear;
  int chunk_count = 0;

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        chunk_count++;
        // This predicate guarantees that there is only a single zero-init
        // (memset) per chunk, and if present it will be at the beginning.
        bool same =
            HasByteIndex(a) == HasByteIndex(b) &&
            a->is_repeated() == b->is_repeated() &&
            IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
            ShouldSplit(a, options_) == ShouldSplit(b, options_) &&
            (CanClearByZeroing(a) == CanClearByZeroing(b) ||
             (CanClearByZeroing(a) && (chunk_count == 1 || merge_zero_init)));
        if (!same) chunk_count = 0;
        return same;
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check = MaybeEmitHaswordsCheck(
        it, next, options_, has_bit_indices_, cached_has_word_index, "", p);
    bool has_default_split_check = !it->fields.empty() && it->should_split;
    if (has_default_split_check) {
      // Some fields are cleared without checking has_bit. So we add the
      // condition here to avoid writing to the default split instance.
      format("if (!IsSplitMessageDefault()) {\n");
      format.Indent();
    }
    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      bool chunk_is_split = it->should_split;
      ABSL_CHECK_EQ(has_default_split_check, chunk_is_split);

      const FieldDescriptor* memset_start = nullptr;
      const FieldDescriptor* memset_end = nullptr;
      bool saw_non_zero_init = false;

      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) {
          ABSL_CHECK(!saw_non_zero_init);
          if (!memset_start) memset_start = field;
          memset_end = field;
        } else {
          saw_non_zero_init = true;
        }
      }

      // Whether we wrap this chunk in:
      //   if (cached_has_bits & <chunk hasbits) { /* chunk. */ }
      // We can omit the if() for chunk size 1, or if our fields do not have
      // hasbits. I don't understand the rationale for the last part of the
      // condition, but it matches the old logic.
      const bool check_has_byte =
          HasBitIndex(fields.front()) != kNoHasbit && fields.size() > 1 &&
          !IsLikelyPresent(fields.back(), options_) &&
          (memset_end != fields.back() || merge_zero_init);

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);
        std::string chunk_mask_str =
            absl::StrCat(absl::Hex(chunk_mask, absl::kZeroPad8));

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        if (cached_has_word_index != HasWordIndex(fields.front())) {
          cached_has_word_index = HasWordIndex(fields.front());
          format("cached_has_bits = $has_bits$[$1$];\n", cached_has_word_index);
        }
        format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
        format.Indent();
      }

      if (memset_start) {
        if (memset_start == memset_end) {
          // For clarity, do not memset a single field.
          field_generators_.get(memset_start).GenerateMessageClearingCode(p);
        } else {
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_start, options_));
          ABSL_CHECK_EQ(chunk_is_split, ShouldSplit(memset_end, options_));
          format(
              "::memset(&$1$, 0, static_cast<::size_t>(\n"
              "    reinterpret_cast<char*>(&$2$) -\n"
              "    reinterpret_cast<char*>(&$1$)) + sizeof($2$));\n",
              FieldMemberName(memset_start, chunk_is_split),
              FieldMemberName(memset_end, chunk_is_split));
        }
      }

      // Clear all non-zero-initializable fields in the chunk.
      for (const auto& field : fields) {
        if (CanClearByZeroing(field)) continue;
        // It's faster to just overwrite primitive types, but we should only
        // clear strings and messages if they were set.
        //
        // TODO:  Let the CppFieldGenerator decide this somehow.
        bool have_enclosing_if =
            HasBitIndex(field) != kNoHasbit &&
            (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
             field->cpp_type() == FieldDescriptor::CPPTYPE_STRING);

        if (have_enclosing_if) {
          PrintPresenceCheck(field, has_bit_indices_, p,
                             &cached_has_word_index);
          format.Indent();
        }

        field_generators_.get(field).GenerateMessageClearingCode(p);

        if (have_enclosing_if) {
          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_default_split_check) {
      format.Outdent();
      format("}\n");
    }
    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }
  // Step 4: Unions.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("clear_$1$();\n", oneof->name());
  }

  if (num_weak_fields_) {
    format("$weak_field_map$.ClearAll();\n");
  }

  // We don't clear donated status.

  if (!has_bit_indices_.empty()) {
    // Step 5: Everything else.
    format("$has_bits$.Clear();\n");
  }

  format("_internal_metadata_.Clear<$unknown_fields_type$>();\n");

  format.Outdent();
  format("}\n");
}